

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

Duration * google::protobuf::operator-=(Duration *d1,Duration *d2)

{
  void *pvVar1;
  Duration local_38;
  
  util::anon_unknown_1::CreateNormalized<google::protobuf::Duration>
            (&local_38,d1->seconds_ - d2->seconds_,(long)d1->nanos_ - (long)d2->nanos_);
  pvVar1 = (d1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    pvVar1 = *(void **)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  if (((ulong)local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(void **)((ulong)local_38.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                   0xfffffffffffffffe);
  }
  if (pvVar1 == local_38.super_Message.super_MessageLite._internal_metadata_.ptr_) {
    if (&local_38 != d1) {
      Duration::InternalSwap(d1,&local_38);
    }
  }
  else {
    Duration::CopyFrom(d1,&local_38);
  }
  Duration::~Duration(&local_38);
  return d1;
}

Assistant:

Duration& operator-=(Duration& d1, const Duration& d2) {  // NOLINT
  d1 = CreateNormalized<Duration>(d1.seconds() - d2.seconds(),
                                  d1.nanos() - d2.nanos());
  return d1;
}